

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::textureTypeHasDepth(GLenum textureBindTarget)

{
  undefined1 local_9;
  GLenum textureBindTarget_local;
  
  if (textureBindTarget == 0xde1) {
    local_9 = false;
  }
  else if (textureBindTarget == 0x806f) {
    local_9 = true;
  }
  else if (textureBindTarget == 0x8513) {
    local_9 = false;
  }
  else if (textureBindTarget == 0x8c1a) {
    local_9 = true;
  }
  else if (textureBindTarget == 0x8c2a) {
    local_9 = false;
  }
  else if (textureBindTarget == 0x9009) {
    local_9 = true;
  }
  else if (textureBindTarget == 0x9100) {
    local_9 = false;
  }
  else if (textureBindTarget == 0x9102) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool textureTypeHasDepth (glw::GLenum textureBindTarget)
{
	switch (textureBindTarget)
	{
		case GL_TEXTURE_2D:						return false;
		case GL_TEXTURE_3D:						return true;
		case GL_TEXTURE_2D_ARRAY:				return true;
		case GL_TEXTURE_CUBE_MAP:				return false;
		case GL_TEXTURE_2D_MULTISAMPLE:			return false;
		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:	return true;
		case GL_TEXTURE_BUFFER:					return false;
		case GL_TEXTURE_CUBE_MAP_ARRAY:			return true;
		default:
			DE_ASSERT(DE_FALSE);
			return false;
	}
}